

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O1

bool __thiscall Task::contains(Task *this,OperandHandle *operand,bool is_out)

{
  element_type *peVar1;
  undefined7 in_register_00000011;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__range1;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__x;
  bool bVar2;
  vector<OperandUsage,_std::allocator<OperandUsage>_> vec;
  vector<OperandUsage,_std::allocator<OperandUsage>_> local_28;
  
  __x = &this->ins;
  if ((int)CONCAT71(in_register_00000011,is_out) != 0) {
    __x = &this->outs;
  }
  std::vector<OperandUsage,_std::allocator<OperandUsage>_>::vector(&local_28,__x);
  bVar2 = local_28.super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_28.super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
          super__Vector_impl_data._M_finish;
  if (bVar2) {
    peVar1 = ((local_28.super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
               super__Vector_impl_data._M_start)->operand).
             super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    while (peVar1 != (operand->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
      local_28.super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_28.super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
      bVar2 = local_28.super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_28.super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
              super__Vector_impl_data._M_finish;
      if (local_28.super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_28.super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      peVar1 = ((local_28.super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                 super__Vector_impl_data._M_start)->operand).
               super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
  }
  std::vector<OperandUsage,_std::allocator<OperandUsage>_>::~vector(&local_28);
  return bVar2;
}

Assistant:

bool contains(const OperandHandle &operand, bool is_out=true) const {
        auto vec = is_out ? outs : ins;
        for (auto &usage: vec) {
            if (usage.operand == operand) {
                return true;
            }
        }
        return false;
    }